

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_EqualityReflexive_Test::TestBody
          (StatePointer_EqualityReflexive_Test *this)

{
  bool bVar1;
  char *message;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> local_48;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p;
  undefined1 local_38 [4];
  Foo foo;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            (&local_48,(pointer_type)((long)&p.m_ptr_and_state + 4),1);
  testing::internal::EqHelper<false>::
  Compare<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((EqHelper<false> *)local_38,"p","p",&local_48,&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x55,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST(StatePointer, EqualityReflexive) {
	Foo foo;
	state_ptr<Foo> p{&foo, 1};
	EXPECT_EQ(p, p);
}